

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

Bond * __thiscall OpenMD::SelectionManager::beginUnselectedBond(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  Bond *pBVar3;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  if ((**(byte **)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) != 0) {
    iVar2 = OpenMDBitSet::nextOffBit(pOVar1 + 1,0);
  }
  *i = iVar2;
  if (iVar2 == -1) {
    pBVar3 = (Bond *)0x0;
  }
  else {
    pBVar3 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2];
  }
  return pBVar3;
}

Assistant:

Bond* SelectionManager::beginUnselectedBond(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (!ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].firstOffBit();
    return i == -1 ? NULL : bonds_[i];
#endif
  }